

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O1

_Bool parse_length_value(char **begin,char *end,length_t *length,_Bool negative)

{
  char *pcVar1;
  _Bool _Var2;
  char cVar3;
  char cVar4;
  char *it;
  float value;
  char *local_30;
  float local_24;
  
  local_24 = 0.0;
  local_30 = *begin;
  _Var2 = parse_float(&local_30,end,&local_24);
  if (!_Var2) {
    return false;
  }
  cVar3 = '\0';
  if ((!negative) && (local_24 < 0.0)) {
    return false;
  }
  if (local_30 < end) {
    cVar3 = *local_30;
  }
  pcVar1 = local_30 + 1;
  cVar4 = '\0';
  if (pcVar1 < end) {
    cVar4 = *pcVar1;
  }
  if (cVar3 < 'i') {
    if (cVar3 == '%') {
      length->value = local_24;
      length->type = length_type_percent;
      local_30 = pcVar1;
      goto LAB_001069e3;
    }
    if (cVar3 != 'c') {
LAB_001069ae:
      length->value = local_24;
      length->type = length_type_fixed;
      goto LAB_001069e3;
    }
    if (cVar4 != 'm') {
      return false;
    }
    local_24 = (local_24 * 96.0) / 2.54;
  }
  else if (cVar3 == 'i') {
    if (cVar4 != 'n') {
      return false;
    }
    local_24 = local_24 * 96.0;
  }
  else if (cVar3 == 'm') {
    if (cVar4 != 'm') {
      return false;
    }
    local_24 = (local_24 * 96.0) / 25.4;
  }
  else {
    if (cVar3 != 'p') goto LAB_001069ae;
    if (cVar4 != 'x') {
      if (cVar4 == 't') {
        local_24 = (local_24 * 96.0) / 72.0;
      }
      else {
        if (cVar4 != 'c') {
          return false;
        }
        local_24 = (local_24 * 96.0) / 6.0;
      }
    }
  }
  length->value = local_24;
  length->type = length_type_fixed;
  local_30 = local_30 + 2;
LAB_001069e3:
  *begin = local_30;
  return true;
}

Assistant:

static bool parse_length_value(const char** begin, const char* end, length_t* length, bool negative)
{
    float value = 0;
    const char* it = *begin;
    if(!parse_float(&it, end, &value))
        return false;
    if(!negative && value < 0.f) {
        return false;
    }

    char units[2] = {0, 0};
    if(it + 0 < end)
        units[0] = it[0];
    if(it + 1 < end) {
        units[1] = it[1];
    }

    static const float dpi = 96.f;
    switch(units[0]) {
    case '%':
        length->value = value;
        length->type = length_type_percent;
        it += 1;
        break;
    case 'p':
        if(units[1] == 'x')
            length->value = value;
        else if(units[1] == 'c')
            length->value = value * dpi / 6.f;
        else if(units[1] == 't')
            length->value = value * dpi / 72.f;
        else
            return false;
        length->type = length_type_fixed;
        it += 2;
        break;
    case 'i':
        if(units[1] == 'n')
            length->value = value * dpi;
        else
            return false;
        length->type = length_type_fixed;
        it += 2;
        break;
    case 'c':
        if(units[1] == 'm')
            length->value = value * dpi / 2.54f;
        else
            return false;
        length->type = length_type_fixed;
        it += 2;
        break;
    case 'm':
        if(units[1] == 'm')
            length->value = value * dpi / 25.4f;
        else
            return false;
        length->type = length_type_fixed;
        it += 2;
        break;
    default:
        length->value = value;
        length->type = length_type_fixed;
        break;
    }

    *begin = it;
    return true;
}